

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_main.c
# Opt level: O3

void cpuid_grow_raw_data_array(cpu_raw_data_array_t *raw_array,logical_cpu_t n)

{
  ushort uVar1;
  cpu_raw_data_t *pcVar2;
  undefined4 *puVar3;
  int iVar4;
  undefined6 in_register_00000032;
  ushort uVar5;
  ulong uVar6;
  
  iVar4 = (int)CONCAT62(in_register_00000032,n);
  if (iVar4 != 0) {
    uVar6 = CONCAT62(in_register_00000032,n) & 0xffffffff;
    uVar5 = (ushort)uVar6;
    if (raw_array->num_raw <= uVar5) {
      debugf(3,"Growing cpu_raw_data_array_t from %u to %u items\n",(ulong)raw_array->num_raw,uVar6)
      ;
      pcVar2 = (cpu_raw_data_t *)realloc(raw_array->raw,(ulong)n * 0x6b0);
      if (pcVar2 == (cpu_raw_data_t *)0x0) {
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_00134f60);
        *puVar3 = 0xfffffffd;
      }
      else {
        uVar1 = raw_array->num_raw;
        if (uVar1 < uVar5) {
          memset(pcVar2 + uVar1,0,(ulong)(~(uint)uVar1 + iVar4 & 0xffff) * 0x6b0 + 0x6b0);
        }
        raw_array->num_raw = uVar5;
        raw_array->raw = pcVar2;
      }
    }
  }
  return;
}

Assistant:

static void cpuid_grow_raw_data_array(struct cpu_raw_data_array_t* raw_array, logical_cpu_t n)
{
	logical_cpu_t i;
	struct cpu_raw_data_t *tmp = NULL;

	if ((n <= 0) || (n < raw_array->num_raw)) return;
	debugf(3, "Growing cpu_raw_data_array_t from %u to %u items\n", raw_array->num_raw, n);
	tmp = realloc(raw_array->raw, sizeof(struct cpu_raw_data_t) * n);
	if (tmp == NULL) { /* Memory allocation failure */
		cpuid_set_error(ERR_NO_MEM);
		return;
	}

	for (i = raw_array->num_raw; i < n; i++)
		raw_data_t_constructor(&tmp[i]);
	raw_array->num_raw = n;
	raw_array->raw     = tmp;
}